

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmMakefile *this_00;
  cmDependsFortranInternals *pcVar3;
  char *mod_dir;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  string fiName;
  string fcName;
  string mod_lower;
  string stamp;
  string mod_upper;
  cmGeneratedFileStream fiStream;
  cmGeneratedFileStream fcStream;
  string local_598;
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  ostream *local_538;
  string local_530;
  pointer local_510;
  ostream *local_508;
  string local_500;
  string local_4e0;
  undefined1 local_4c0 [584];
  cmGeneratedFileStream local_278;
  
  LocateModules(this);
  pcVar2 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
  local_4c0._0_8_ = local_4c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,"CMAKE_Fortran_TARGET_MODULE_DIR","");
  mod_dir = cmMakefile::GetDefinition(this_00,(string *)local_4c0);
  local_508 = makeDepends;
  if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  local_510 = pcVar2;
  if (mod_dir == (char *)0x0) {
    mod_dir = cmMakefile::GetCurrentBinaryDirectory
                        (((this->super_cmDepends).LocalGenerator)->Makefile);
  }
  poVar5 = local_508;
  pcVar2 = local_510;
  pcVar3 = this->Internal;
  local_538 = internalDepends;
  for (p_Var4 = (pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    WriteDependenciesReal
              (this,*(char **)(p_Var4 + 1),(cmDependsFortranSourceInfo *)(p_Var4 + 2),mod_dir,pcVar2
               ,poVar5,local_538);
  }
  local_578[0] = local_568;
  pcVar2 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  local_538 = (ostream *)mod_dir;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_578,pcVar2,
             pcVar2 + (this->super_cmDepends).TargetDirectory._M_string_length);
  std::__cxx11::string::append((char *)local_578);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_4c0,(char *)local_578[0],false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c0,"# The fortran modules provided by this target.\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"provides\n",9);
  pcVar3 = this->Internal;
  p_Var6 = (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0," ",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_4c0,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  if ((pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_558[0] = local_548;
    pcVar2 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_558,pcVar2,
               pcVar2 + (this->super_cmDepends).TargetDirectory._M_string_length);
    std::__cxx11::string::append((char *)local_558);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,(char *)local_558[0],false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# Remove fortran modules provided by this target.\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"FILE(REMOVE",0xb);
    p_Var6 = (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        std::__cxx11::string::string((string *)&local_4e0,(char *)local_538,(allocator *)&local_530)
        ;
        std::__cxx11::string::append((char *)&local_4e0);
        cmsys::SystemTools::UpperCase(&local_530,(string *)(p_Var6 + 1));
        std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_530._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_4e0);
        std::__cxx11::string::string((string *)&local_530,(char *)local_538,(allocator *)&local_500)
        ;
        std::__cxx11::string::append((char *)&local_530);
        std::__cxx11::string::_M_append((char *)&local_530,*(ulong *)(p_Var6 + 1));
        std::__cxx11::string::append((char *)&local_530);
        std::__cxx11::string::string((string *)&local_500,local_510,(allocator *)&local_598);
        std::__cxx11::string::append((char *)&local_500);
        std::__cxx11::string::_M_append((char *)&local_500,*(ulong *)(p_Var6 + 1));
        std::__cxx11::string::append((char *)&local_500);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::Convert
                  (&local_598,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                   &local_530,START_OUTPUT,UNCHANGED);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_598._M_dataplus._M_p,
                            local_598._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::Convert
                  (&local_598,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                   &local_4e0,START_OUTPUT,UNCHANGED);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_598._M_dataplus._M_p,
                            local_598._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::Convert
                  (&local_598,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                   &local_500,START_OUTPUT,UNCHANGED);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_598._M_dataplus._M_p,
                            local_598._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n",4);
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
    if (local_558[0] != local_548) {
      operator_delete(local_558[0],local_548[0] + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  return true;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const char* stamp_dir = this->TargetDirectory.c_str();

  // Get the directory in which module files will be created.
  const char* mod_dir;
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  if(const char* target_mod_dir =
     mf->GetDefinition("CMAKE_Fortran_TARGET_MODULE_DIR"))
    {
    mod_dir = target_mod_dir;
    }
  else
    {
    mod_dir =
      this->LocalGenerator->GetMakefile()->GetCurrentBinaryDirectory();
    }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for(ObjectInfoMap::const_iterator i = objInfo.begin();
      i != objInfo.end(); ++i)
    {
    if(!this->WriteDependenciesReal(i->first.c_str(), i->second,
                                    mod_dir, stamp_dir,
                                    makeDepends, internalDepends))
      {
      return false;
      }
    }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName.c_str());
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for(std::set<std::string>::const_iterator i = provides.begin();
      i != provides.end(); ++i)
    {
    fiStream << " " << *i << "\n";
    }

  // Create a script to clean the modules.
  if(!provides.empty())
    {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName.c_str());
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    for(std::set<std::string>::const_iterator i = provides.begin();
        i != provides.end(); ++i)
      {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      mod_upper += cmSystemTools::UpperCase(*i);
      mod_upper += ".mod";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      mod_lower += *i;
      mod_lower += ".mod";
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += *i;
      stamp += ".mod.stamp";
      fcStream << "\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(mod_lower,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(mod_upper,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(stamp,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      }
    fcStream << "  )\n";
    }
  return true;
}